

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

bool sanityCheck(QList<QWidget_*> *widgets,int index,char *where)

{
  undefined4 in_register_00000034;
  
  if (((int)where < 0) || (CONCAT44(in_register_00000034,index) <= ((ulong)where & 0xffffffff))) {
    sanityCheck();
  }
  else {
    if ((&(widgets->d).d)[(ulong)where & 0xffffffff] != (Data *)0x0) {
      return true;
    }
    sanityCheck();
  }
  return false;
}

Assistant:

static bool sanityCheck(const QList<QWidget *> &widgets, const int index, const char *where)
{
    if (Q_UNLIKELY(index < 0 || index >= widgets.size())) {
        const char error[] = "index out of range";
        Q_ASSERT_X(false, where, error);
        qWarning("%s:%s", where, error);
        return false;
    }
    if (Q_UNLIKELY(!widgets.at(index))) {
        const char error[] = "null pointer";
        Q_ASSERT_X(false, where, error);
        qWarning("%s:%s", where, error);
        return false;
    }
    return true;
}